

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::AnyLocsAreLive
          (EliminateDeadOutputStoresPass *this,uint32_t start,uint32_t count)

{
  bool bVar1;
  _Node_iterator_base<unsigned_int,_false> local_38;
  _Node_iterator_base<unsigned_int,_false> local_30;
  uint local_28;
  uint local_24;
  uint32_t u;
  uint32_t finish;
  uint32_t count_local;
  uint32_t start_local;
  EliminateDeadOutputStoresPass *this_local;
  
  local_24 = start + count;
  local_28 = start;
  u = count;
  finish = start;
  _count_local = this;
  while( true ) {
    if (local_24 <= local_28) {
      return false;
    }
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(this->live_locs_,&local_28);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end(this->live_locs_);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool EliminateDeadOutputStoresPass::AnyLocsAreLive(uint32_t start,
                                                   uint32_t count) {
  auto finish = start + count;
  for (uint32_t u = start; u < finish; ++u) {
    if (live_locs_->find(u) != live_locs_->end()) return true;
  }
  return false;
}